

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrobjs.c
# Opt level: O1

FT_Error pfr_face_init(FT_Stream stream,FT_Face pfrface,FT_Int face_index,FT_Int num_params,
                      FT_Parameter *params)

{
  byte *pbVar1;
  ushort *puVar2;
  byte bVar3;
  short sVar4;
  short sVar5;
  int iVar6;
  FT_String *pFVar7;
  bool bVar8;
  FT_Stream pFVar9;
  FT_ListNode pFVar10;
  long lVar11;
  FT_UShort FVar12;
  ushort uVar13;
  ushort uVar14;
  FT_Error FVar15;
  FT_ULong FVar16;
  ulong uVar17;
  FT_Bitmap_Size *pFVar18;
  FT_Face pFVar19;
  FT_Face pFVar20;
  FT_Pointer pvVar21;
  uint uVar22;
  int iVar23;
  long lVar24;
  ushort *puVar25;
  int *piVar26;
  ushort *puVar27;
  uint *puVar28;
  FT_Face pFVar29;
  byte *pbVar30;
  FT_Face pFVar31;
  uint uVar32;
  undefined4 uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  FT_UInt count;
  FT_Face pFVar37;
  ushort *puVar38;
  FT_Error error_1;
  FT_Error error;
  FT_CharMapRec charmap;
  uint local_a0;
  uint local_9c;
  FT_CharMapRec_ local_98;
  FT_Size local_88;
  undefined8 local_80;
  FT_Face local_78;
  undefined8 local_70;
  uint local_64;
  ulong local_60;
  ulong local_58;
  FT_Long *local_50;
  FT_String **local_48;
  ulong local_40;
  ulong local_38;
  ulong new_count;
  
  local_9c = FT_Stream_Seek(stream,0);
  if ((local_9c == 0) &&
     (local_9c = FT_Stream_ReadFields(stream,pfr_header_fields,pfrface + 1), local_9c == 0)) {
    piVar26 = (int *)((long)&pfrface[1].num_glyphs + 4);
    *piVar26 = *piVar26 + pfrface[1].num_charmaps * 0x10000;
    local_9c = 0;
  }
  if (local_9c != 0) {
    return local_9c;
  }
  if (((((int)pfrface[1].num_faces != 0x50465230) ||
       (4 < *(uint *)((long)&pfrface[1].num_faces + 4))) ||
      (*(uint *)((long)&pfrface[1].face_index + 4) < 0x3a)) || ((int)pfrface[1].face_index != 0xd0a)
     ) {
    return 2;
  }
  uVar17 = (ulong)*(uint *)((long)&pfrface[1].face_flags + 4);
  local_98.face._0_4_ = FT_Stream_Seek(stream,uVar17);
  if (((uint)local_98.face == 0) &&
     (FVar12 = FT_Stream_ReadUShort(stream,(FT_Error *)&local_98), (uint)local_98.face == 0)) {
    if ((0x3332 < FVar12) ||
       ((stream->size - uVar17 <= (ulong)((uint)FVar12 + (uint)FVar12 * 4 + 2) ||
        (stream->size <= (ulong)((((uint)FVar12 + (uint)FVar12 * 2) * 8 - (uint)FVar12) + 0x5f)))))
    {
      local_98.face._0_4_ = 8;
      goto LAB_00148afa;
    }
    uVar17 = (ulong)(uint)FVar12;
  }
  else {
LAB_00148afa:
    uVar17 = 0;
  }
  local_9c = (uint)local_98.face;
  if ((uint)local_98.face == 0) {
    pfrface->num_faces = uVar17;
  }
  if (face_index < 0 || (uint)local_98.face != 0) {
    return (uint)local_98.face;
  }
  uVar35 = face_index & 0xffff;
  if (pfrface->num_faces <= (long)(ulong)uVar35) {
    return 6;
  }
  iVar23 = pfrface[1].num_charmaps;
  FVar15 = FT_Stream_Seek(stream,(ulong)*(uint *)((long)&pfrface[1].face_flags + 4));
  local_98.face = (FT_Face)CONCAT44(local_98.face._4_4_,FVar15);
  if (FVar15 == 0) {
    FVar12 = FT_Stream_ReadUShort(stream,(FT_Error *)&local_98);
    if ((uint)local_98.face != 0) goto switchD_0014978b_caseD_2;
    uVar32 = 6;
    if (uVar35 < FVar12) {
      FVar15 = FT_Stream_Skip(stream,(ulong)(uVar35 * 5));
      local_98.face = (FT_Face)CONCAT44(local_98.face._4_4_,FVar15);
      if (FVar15 == 0) {
        FVar12 = FT_Stream_ReadUShort(stream,(FT_Error *)&local_98);
        if ((uint)local_98.face == 0) {
          FVar16 = FT_Stream_ReadUOffset(stream,(FT_Error *)&local_98);
          if ((uint)local_98.face == 0) {
            uVar22 = (uint)FVar12;
            *(uint *)((long)&pfrface[1].bbox.xMin + 4) = uVar22;
            *(int *)&pfrface[1].bbox.yMin = (int)FVar16;
            FVar15 = FT_Stream_Seek(stream,FVar16 & 0xffffffff);
            local_98.face = (FT_Face)CONCAT44(local_98.face._4_4_,FVar15);
            local_88._0_4_ = 2;
            uVar32 = (uint)local_88;
            local_88._0_4_ = 2;
            if (FVar15 == 0) {
              FVar15 = FT_Stream_EnterFrame(stream,(ulong)uVar22);
              local_98.face = (FT_Face)CONCAT44(local_98.face._4_4_,FVar15);
              uVar32 = (uint)local_88;
              if (FVar15 == 0) {
                if (0xc < FVar12) {
                  pbVar30 = stream->cursor;
                  puVar38 = (ushort *)(pbVar30 + uVar22);
                  *(uint *)((long)&pfrface[1].bbox.yMin + 4) =
                       (uint)pbVar30[2] | (uint)pbVar30[1] << 8 | (uint)*pbVar30 << 0x10;
                  *(uint *)&pfrface[1].bbox.xMax =
                       (uint)pbVar30[5] | (uint)pbVar30[4] << 8 | (uint)pbVar30[3] << 0x10;
                  *(uint *)((long)&pfrface[1].bbox.xMax + 4) =
                       (uint)pbVar30[8] | (uint)pbVar30[7] << 8 | (uint)pbVar30[6] << 0x10;
                  *(uint *)&pfrface[1].bbox.yMax =
                       (uint)pbVar30[0xb] | (uint)pbVar30[10] << 8 | (uint)pbVar30[9] << 0x10;
                  puVar27 = (ushort *)(pbVar30 + 0xd);
                  bVar3 = pbVar30[0xc];
                  uVar32 = 0;
                  if ((bVar3 & 4) != 0) {
                    uVar22 = (uint)((bVar3 & 8) == 0);
                    uVar32 = uVar22 ^ 5;
                    if ((bVar3 & 3) != 0) {
                      uVar32 = 2 - uVar22;
                    }
                  }
                  if ((ushort *)
                      ((ulong)((2 - ((bVar3 & 0x20) == 0) & (int)((uint)bVar3 << 0x1b) >> 0x1f) +
                              uVar32) + (long)puVar27) <= puVar38) {
                    if ((bVar3 & 4) != 0) {
                      uVar14 = *puVar27;
                      uVar32 = (uint)(ushort)(byte)uVar14;
                      if ((bVar3 & 8) == 0) {
                        puVar27 = (ushort *)(pbVar30 + 0xe);
                      }
                      else {
                        puVar27 = (ushort *)(pbVar30 + 0xf);
                        uVar32 = (int)(short)((ushort)(byte)uVar14 << 8) | (uint)pbVar30[0xe];
                      }
                      pfrface[1].units_per_EM = (short)uVar32;
                      pfrface[1].ascender = (short)(uVar32 >> 0x10);
                      if ((bVar3 & 3) == 0) {
                        uVar14 = *puVar27;
                        pbVar30 = (byte *)((long)puVar27 + 1);
                        puVar25 = puVar27 + 1;
                        puVar27 = (ushort *)((long)puVar27 + 3);
                        uVar32 = (uint)(byte)*puVar25 |
                                 (uint)*pbVar30 << 8 | (uint)(byte)uVar14 << 0x10;
                        pfrface[1].max_advance_width = (short)uVar32;
                        pfrface[1].max_advance_height = (short)(uVar32 >> 0x10);
                      }
                    }
                    if ((bVar3 & 0x10) != 0) {
                      uVar14 = *puVar27;
                      uVar32 = (uint)(ushort)(byte)uVar14;
                      if ((bVar3 & 0x20) == 0) {
                        puVar27 = (ushort *)((long)puVar27 + 1);
                      }
                      else {
                        pbVar30 = (byte *)((long)puVar27 + 1);
                        puVar27 = puVar27 + 1;
                        uVar32 = (int)(short)((ushort)(byte)uVar14 << 8) | (uint)*pbVar30;
                      }
                      pfrface[1].descender = (short)uVar32;
                      pfrface[1].height = (short)(uVar32 >> 0x10);
                    }
                    if ((bVar3 & 0x40) != 0) {
                      puVar25 = (ushort *)((long)puVar27 + 1);
                      local_88._0_4_ = 8;
                      uVar33 = 0;
                      if (puVar38 < puVar25) {
LAB_00149722:
                        bVar8 = false;
                        uVar33 = 8;
                      }
                      else {
                        uVar14 = *puVar27;
                        uVar32 = (uint)(byte)uVar14;
                        bVar8 = true;
                        puVar27 = puVar25;
                        if ((byte)uVar14 != 0) {
                          uVar33 = 0;
                          do {
                            puVar2 = puVar25 + 1;
                            puVar27 = puVar25;
                            if ((puVar38 < puVar2) ||
                               (puVar25 = (ushort *)((ulong)(byte)*puVar25 + (long)puVar2),
                               puVar27 = puVar2, puVar38 < puVar25)) goto LAB_00149722;
                            uVar32 = uVar32 - 1;
                            puVar27 = puVar25;
                          } while (uVar32 != 0);
                        }
                      }
                      local_98.face = (FT_Face)CONCAT44(local_98.face._4_4_,uVar33);
                      uVar32 = (uint)local_88;
                      if (!bVar8) goto LAB_0014976e;
                    }
                    if ((ushort *)((long)puVar27 + 5U) <= puVar38) {
                      uVar14 = *puVar27 << 8 | *puVar27 >> 8;
                      pfrface[1].underline_position = (short)(uint)uVar14;
                      pfrface[1].underline_thickness = (short)((uint)uVar14 >> 0x10);
                      local_88._0_4_ = 0;
                      *(uint *)&pfrface[1].glyph =
                           (uint)(byte)puVar27[2] |
                           (uint)*(byte *)((long)puVar27 + 3) << 8 | (uint)(byte)puVar27[1] << 0x10;
                      uVar32 = (uint)local_88;
                      if ((iVar23 != 0) &&
                         (local_88._0_4_ = 5, uVar32 = (uint)local_88, puVar27 + 3 <= puVar38)) {
                        uVar32 = (uint)CONCAT12(*(byte *)((long)puVar27 + 5U),uVar14);
                        pfrface[1].underline_position = (short)uVar32;
                        pfrface[1].underline_thickness = (short)(uVar32 >> 0x10);
                        local_88._0_4_ = 0;
                        uVar32 = (uint)local_88;
                      }
                      goto LAB_0014976e;
                    }
                  }
                }
                local_88._0_4_ = 5;
                uVar32 = (uint)local_88;
              }
            }
LAB_0014976e:
            local_88._0_4_ = uVar32;
            uVar32 = (uint)local_88;
            switch((uint)local_88) {
            default:
              goto switchD_0014978b_caseD_1;
            case 2:
              break;
            case 5:
              local_98.face = (FT_Face)CONCAT44(local_98.face._4_4_,8);
            case 0:
            case 8:
              FT_Stream_ExitFrame(stream);
            }
          }
        }
      }
      goto switchD_0014978b_caseD_2;
    }
  }
  else {
switchD_0014978b_caseD_2:
    uVar32 = (uint)local_98.face;
  }
switchD_0014978b_caseD_1:
  if (uVar32 != 0) {
    return uVar32;
  }
  uVar22._0_2_ = pfrface[1].underline_position;
  uVar22._2_2_ = pfrface[1].underline_thickness;
  uVar36 = *(uint *)&pfrface[1].glyph;
  local_88 = (FT_Size)stream->memory;
  pfrface[1].size = local_88;
  *(uint *)&pfrface[1].charmap = uVar36;
  pfrface[2].bbox.xMax = 0;
  pfrface[2].bbox.yMax = (FT_Pos)&pfrface[2].bbox.xMax;
  local_9c = uVar32;
  local_a0 = FT_Stream_Seek(stream,(ulong)uVar36);
  uVar32 = local_a0;
  if ((local_a0 != 0) ||
     (local_a0 = FT_Stream_EnterFrame(stream,(ulong)uVar22), uVar32 = local_a0, local_a0 != 0))
  goto LAB_00148d64;
  pFVar37 = (FT_Face)stream->cursor;
  *(FT_Face *)&pfrface[2].max_advance_width = pFVar37;
  local_98.face = pFVar37;
  if (uVar22 < 0xf) {
LAB_00148d36:
    local_a0 = 8;
  }
  else {
    *(uint *)((long)&pfrface[1].charmap + 4) =
         (uint)(ushort)(*(ushort *)&pFVar37->num_faces << 8 | *(ushort *)&pFVar37->num_faces >> 8);
    uVar14 = *(ushort *)((long)&pFVar37->num_faces + 2);
    *(uint *)&pfrface[1].driver = (uint)(ushort)(uVar14 << 8 | uVar14 >> 8);
    uVar14 = *(ushort *)((long)&pFVar37->num_faces + 4);
    *(uint *)((long)&pfrface[1].driver + 4) = (uint)(ushort)(uVar14 << 8 | uVar14 >> 8);
    pfrface[1].memory =
         (FT_Memory)
         ((long)(short)((ushort)*(byte *)((long)&pFVar37->num_faces + 6) << 8) |
         (ulong)*(byte *)((long)&pFVar37->num_faces + 7));
    pfrface[1].stream =
         (FT_Stream)
         ((long)(short)((ushort)*(byte *)&pFVar37->face_index << 8) |
         (ulong)*(byte *)((long)&pFVar37->face_index + 1));
    pfrface[1].sizes_list.head =
         (FT_ListNode)
         ((long)(short)((ushort)*(byte *)((long)&pFVar37->face_index + 2) << 8) |
         (ulong)*(byte *)((long)&pFVar37->face_index + 3));
    pfrface[1].sizes_list.tail =
         (FT_ListNode)
         ((long)(short)((ushort)*(byte *)((long)&pFVar37->face_index + 4) << 8) |
         (ulong)*(byte *)((long)&pFVar37->face_index + 5));
    local_98.face = (FT_Face)((long)&pFVar37->face_index + 7);
    bVar3 = *(byte *)((long)&pFVar37->face_index + 6);
    *(uint *)&pfrface[1].autohint.data = (uint)bVar3;
    local_64 = bVar3 & 4;
    if ((bVar3 & 4) == 0) {
      if (uVar22 < 0x11) goto LAB_00148d36;
      local_98.face = (FT_Face)((long)&pFVar37->face_flags + 1);
      *(uint *)((long)&pfrface[1].autohint.data + 4) =
           (int)(short)((ushort)*(byte *)((long)&pFVar37->face_index + 7) << 8) |
           (uint)(byte)pFVar37->face_flags;
    }
    pFVar37 = (FT_Face)((long)&pFVar37->num_faces + (ulong)uVar22);
    local_58 = (ulong)bVar3;
    if ((-1 < (char)bVar3) ||
       (local_a0 = pfr_extra_items_parse
                             ((FT_Byte **)&local_98,(FT_Byte *)pFVar37,pfr_phy_font_extra_items,
                              &pfrface[1].size), local_a0 == 0)) {
      pFVar31 = (FT_Face)((long)&(local_98.face)->num_faces + 3);
      if (pFVar31 <= pFVar37) {
        uVar17 = (ulong)*(byte *)((long)&(local_98.face)->num_faces + 2) |
                 (ulong)((uint)*(byte *)((long)&(local_98.face)->num_faces + 1) << 8 |
                        (uint)*(byte *)&(local_98.face)->num_faces << 0x10);
        local_98.face = pFVar31;
        if (uVar17 != 0) {
          local_98.face = (FT_Face)((long)&pFVar31->num_faces + uVar17);
          local_80 = CONCAT44(local_80._4_4_,5);
          pFVar19 = local_98.face;
          local_70 = local_98.face;
          if (local_98.face <= pFVar37) {
            local_48 = &pfrface[2].family_name;
            pFVar19 = (FT_Face)&pfrface[2].num_glyphs;
            pFVar20 = pFVar31;
            local_50 = (FT_Long *)pFVar19;
            do {
              local_80 = local_80 & 0xffffffff00000000;
              pFVar31 = local_98.face;
              if (uVar17 == 0) goto LAB_00149388;
              pFVar31 = (FT_Face)((long)&pFVar20->num_faces + 4);
              iVar23 = 0xe;
              pFVar19 = pFVar31;
              pFVar29 = pFVar20;
              if (pFVar31 <= local_70) {
                pFVar19 = (FT_Face)((long)&pFVar20->num_faces + 2);
                uVar14 = *(ushort *)&pFVar20->num_faces << 8 | *(ushort *)&pFVar20->num_faces >> 8;
                pFVar29 = pFVar19;
                local_78 = pFVar31;
                if (3 < uVar14) {
                  local_40 = (ulong)uVar14;
                  local_38 = uVar17 - local_40;
                  local_60 = uVar17;
                  if (local_40 <= uVar17) {
                    uVar13 = *(ushort *)((long)&pFVar20->num_faces + 2);
                    uVar13 = uVar13 << 8 | uVar13 >> 8;
                    if (uVar13 == 3) {
                      local_a0 = pfr_aux_name_load((FT_Byte *)pFVar31,uVar14 - 4,(FT_Memory)local_88
                                                   ,local_48);
joined_r0x00149363:
                      iVar23 = 2;
                      pFVar19 = (FT_Face)(ulong)local_a0;
                      pFVar29 = local_78;
                      uVar17 = local_60;
                      if (local_a0 != 0) goto LAB_00149374;
                    }
                    else {
                      pFVar19 = (FT_Face)(ulong)uVar13;
                      if (uVar13 == 2) {
                        if (0x23 < uVar14) {
                          *(uint *)&pfrface[1].autohint.finalizer =
                               (int)(short)((ushort)*(byte *)((long)&pFVar20->face_index + 6) << 8)
                               | (uint)*(byte *)((long)&pFVar20->face_index + 7);
                          *(uint *)((long)&pfrface[1].autohint.finalizer + 4) =
                               (int)(short)((ushort)*(byte *)&pFVar20->face_flags << 8) |
                               (uint)*(byte *)((long)&pFVar20->face_flags + 1);
                          uVar32 = (int)(short)((ushort)*(byte *)((long)&pFVar20->face_flags + 2) <<
                                               8) | (uint)*(byte *)((long)&pFVar20->face_flags + 3);
                          pFVar19 = (FT_Face)(ulong)uVar32;
                          *(uint *)&pfrface[1].extensions = uVar32;
                        }
                      }
                      else if (uVar13 == 1) {
                        local_a0 = pfr_aux_name_load((FT_Byte *)pFVar31,uVar14 - 4,
                                                     (FT_Memory)local_88,(FT_String **)local_50);
                        goto joined_r0x00149363;
                      }
                    }
                    iVar23 = 0;
                    pFVar29 = (FT_Face)((long)&pFVar20->num_faces + local_40);
                    uVar17 = local_38;
                  }
                }
              }
LAB_00149374:
              pFVar20 = pFVar29;
            } while (iVar23 == 0);
            pFVar31 = local_98.face;
            if (iVar23 != 0xe) {
              local_80 = CONCAT44(local_80._4_4_,iVar23);
            }
          }
LAB_00149388:
          local_98.face = pFVar31;
          if ((int)local_80 == 5) goto LAB_00148d36;
          uVar32 = local_a0;
          if (((int)local_80 == 2) || (uVar32 = (uint)pFVar19, (int)local_80 != 0))
          goto LAB_00148d64;
        }
        pFVar19 = local_98.face;
        pFVar31 = (FT_Face)((long)&(local_98.face)->num_faces + 1);
        iVar23 = 5;
        pFVar20 = local_98.face;
        if (pFVar31 <= pFVar37) {
          bVar3 = *(byte *)&(local_98.face)->num_faces;
          local_70 = (FT_Face)(ulong)bVar3;
          *(uint *)&pfrface[2].available_sizes = (uint)bVar3;
          local_80 = (ulong)((uint)bVar3 + (uint)bVar3);
          pFVar20 = (FT_Face)((long)&pFVar31->num_faces + local_80);
          local_98.face = pFVar31;
          if (pFVar20 <= pFVar37) {
            pFVar20 = (FT_Face)ft_mem_realloc((FT_Memory)local_88,4,0,(FT_Long)local_70,(void *)0x0,
                                              (FT_Error *)&local_a0);
            *(FT_Face *)&pfrface[2].num_charmaps = pFVar20;
            iVar23 = 8;
            if (local_a0 == 0) {
              if (local_70 != (FT_Face)0x0) {
                uVar17 = 0;
                do {
                  *(uint *)((long)&pFVar20->num_faces + uVar17 * 2) =
                       (int)(short)((ushort)*(byte *)((long)&pFVar31->num_faces + uVar17) << 8) |
                       (uint)*(byte *)((long)&pFVar19->num_faces + uVar17 + 2);
                  uVar17 = uVar17 + 2;
                } while (local_80 != uVar17);
                pFVar31 = (FT_Face)((long)&pFVar31->num_faces + uVar17);
              }
              iVar23 = 0;
              local_98.face = pFVar31;
            }
          }
        }
        if (iVar23 == 8) goto LAB_00148d3e;
        if (iVar23 != 5) {
          uVar32 = (uint)pFVar20;
          if (iVar23 != 0) goto LAB_00148d64;
          pFVar31 = (FT_Face)&(local_98.face)->face_index;
          if (pFVar31 <= pFVar37) {
            *(uint *)&pfrface[2].charmaps = (uint)*(byte *)&(local_98.face)->num_faces;
            *(uint *)((long)&pfrface[2].charmaps + 4) =
                 (uint)*(byte *)((long)&(local_98.face)->num_faces + 1);
            uVar14 = *(ushort *)((long)&(local_98.face)->num_faces + 2);
            *(uint *)&pfrface[2].face_index = (uint)(ushort)(uVar14 << 8 | uVar14 >> 8);
            uVar14 = *(ushort *)((long)&(local_98.face)->num_faces + 4);
            *(uint *)&pfrface[1].internal = (uint)(ushort)(uVar14 << 8 | uVar14 >> 8);
            uVar14 = *(ushort *)((long)&(local_98.face)->num_faces + 6);
            uVar14 = uVar14 << 8 | uVar14 >> 8;
            uVar34 = (uint)uVar14;
            *(uint *)&pfrface[2].generic.data = uVar34;
            pfrface[2].generic.finalizer =
                 (FT_Generic_Finalizer)((long)pFVar31 + ((ulong)uVar36 - (long)stream->cursor));
            uVar22 = (uint)local_58;
            iVar23 = 5;
            uVar32 = 5 - ((local_58 & 2) == 0);
            pvVar21 = (FT_Pointer)(ulong)uVar32;
            uVar36 = (uint)(local_58 >> 3) & 1;
            uVar17 = (ulong)uVar36;
            local_80 = CONCAT44(local_80._4_4_,uVar22) & 0xffffffff00000010;
            local_70 = (FT_Face)(CONCAT44(local_70._4_4_,uVar22) & 0xffffffff00000020);
            local_78 = (FT_Face)CONCAT44(local_78._4_4_,uVar34);
            local_98.face = pFVar31;
            if ((FT_Face)((long)pFVar31 +
                         (ulong)(((local_64 >> 1 | uVar36) +
                                  ((uVar22 & 0x20) >> 5) + ((uVar22 & 0x10) >> 4) + uVar32) *
                                (uint)uVar14)) <= pFVar37) {
              pvVar21 = ft_mem_realloc((FT_Memory)local_88,0x10,0,(ulong)uVar34,(void *)0x0,
                                       (FT_Error *)&local_a0);
              pfrface[2].bbox.xMin = (FT_Pos)pvVar21;
              iVar23 = 8;
              if (local_a0 == 0) {
                if ((int)local_78 != 0) {
                  lVar24 = 0;
                  do {
                    uVar32 = (uint)*(byte *)&pFVar31->num_faces;
                    if ((local_58 & 2) == 0) {
                      pbVar30 = (byte *)((long)&pFVar31->num_faces + 1);
                    }
                    else {
                      pbVar30 = (byte *)((long)&pFVar31->num_faces + 2);
                      uVar32 = (uint)CONCAT11(*(byte *)&pFVar31->num_faces,
                                              *(byte *)((long)&pFVar31->num_faces + 1));
                    }
                    *(uint *)((long)pvVar21 + lVar24) = uVar32;
                    if (local_64 == 0) {
                      uVar32 = *(uint *)((long)&pfrface[1].autohint.data + 4);
                    }
                    else {
                      bVar3 = *pbVar30;
                      pbVar1 = pbVar30 + 1;
                      pbVar30 = pbVar30 + 2;
                      uVar32 = (int)(short)((ushort)bVar3 << 8) | (uint)*pbVar1;
                    }
                    *(uint *)((long)pvVar21 + lVar24 + 4) = uVar32;
                    uVar32 = (uint)pbVar30[uVar17];
                    if ((int)local_80 == 0) {
                      lVar11 = uVar17 + 1;
                    }
                    else {
                      lVar11 = uVar17 + 2;
                      uVar32 = (uint)CONCAT11(pbVar30[uVar17],pbVar30[uVar17 + 1]);
                    }
                    pbVar30 = pbVar30 + lVar11;
                    *(uint *)((long)pvVar21 + lVar24 + 8) = uVar32;
                    uVar32 = (uint)pbVar30[1];
                    if ((int)local_70 == 0) {
                      pFVar31 = (FT_Face)(pbVar30 + 2);
                      uVar22 = (uint)*pbVar30 << 8;
                    }
                    else {
                      uVar32 = (uint)pbVar30[1] << 8 | (uint)*pbVar30 << 0x10;
                      uVar22 = (uint)pbVar30[2];
                      pFVar31 = (FT_Face)(pbVar30 + 3);
                    }
                    *(uint *)((long)pvVar21 + lVar24 + 0xc) = uVar22 | uVar32;
                    lVar24 = lVar24 + 0x10;
                  } while ((ulong)uVar14 << 4 != lVar24);
                }
                iVar23 = 0;
                local_98.face = pFVar31;
              }
            }
            if (iVar23 != 8) {
              if (iVar23 == 5) goto LAB_00148d36;
              uVar32 = (uint)pvVar21;
              if (iVar23 != 0) goto LAB_00148d64;
            }
            goto LAB_00148d3e;
          }
        }
      }
      goto LAB_00148d36;
    }
  }
LAB_00148d3e:
  FT_Stream_ExitFrame(stream);
  FVar16 = FT_Stream_Pos(stream);
  pfrface[2].units_per_EM = (short)FVar16;
  pfrface[2].ascender = (short)(FVar16 >> 0x10);
  pfrface[2].descender = (short)(FVar16 >> 0x20);
  pfrface[2].height = (short)(FVar16 >> 0x30);
  pfrface[2].max_advance_width = 0;
  pfrface[2].max_advance_height = 0;
  pfrface[2].underline_position = 0;
  pfrface[2].underline_thickness = 0;
  uVar32 = local_a0;
LAB_00148d64:
  local_9c = uVar32;
  if (uVar32 == 0) {
    pfrface->face_index = (ulong)uVar35;
    uVar35 = *(uint *)&pfrface[2].generic.data;
    *(byte *)&pfrface->face_flags = (byte)pfrface->face_flags | 1;
    pfrface->num_glyphs = (ulong)uVar35 + 1;
    uVar32 = 0;
    if ((ulong)uVar35 != 0) {
      piVar26 = (int *)(pfrface[2].bbox.xMin + 0xc);
      uVar22 = 0;
      do {
        uVar32 = uVar22;
        if (*piVar26 != 0) break;
        uVar22 = uVar22 + 1;
        piVar26 = piVar26 + 4;
        uVar32 = uVar35;
      } while (uVar35 != uVar22);
    }
    bVar8 = true;
    if (uVar32 == uVar35) {
      if (*(int *)&pfrface[2].style_name == 0) {
        local_9c = 3;
        bVar8 = false;
      }
      else {
        pfrface->face_flags = 0;
      }
    }
    if (bVar8) {
      uVar35 = *(uint *)&pfrface[1].autohint.data;
      if ((uVar35 & 4) == 0) {
        *(byte *)&pfrface->face_flags = (byte)pfrface->face_flags | 4;
      }
      uVar17 = (ulong)((uVar35 & 1) << 4) + 0x10 | pfrface->face_flags;
      pfrface->face_flags = uVar17;
      uVar35 = *(uint *)&pfrface[2].style_name;
      new_count = (ulong)uVar35;
      if (new_count != 0) {
        pfrface->face_flags = uVar17 | 2;
      }
      if ((int)pfrface[2].bbox.yMin != 0) {
        *(byte *)&pfrface->face_flags = (byte)pfrface->face_flags | 0x40;
      }
      pFVar7 = (FT_String *)pfrface[2].num_glyphs;
      pfrface->family_name = pFVar7;
      if (pFVar7 == (FT_String *)0x0) {
        pfrface->family_name = (FT_String *)pfrface[2].style_flags;
      }
      uVar32 = *(uint *)&pfrface[1].driver;
      sVar4 = *(short *)&pfrface[1].sizes_list.tail;
      sVar5 = *(short *)&pfrface[1].stream;
      uVar36 = (uVar32 & 0xffff) * 0xc;
      uVar22 = (int)sVar4 - (int)sVar5;
      if ((int)uVar22 <= (int)(short)((ulong)uVar36 * 0x1999999a >> 0x20)) {
        uVar22 = uVar36 / 10;
      }
      pfrface->style_name = pfrface[2].family_name;
      pfrface->num_fixed_sizes = 0;
      pfrface->available_sizes = (FT_Bitmap_Size *)0x0;
      pFVar9 = pfrface[1].stream;
      (pfrface->bbox).xMin = (FT_Pos)pfrface[1].memory;
      (pfrface->bbox).yMin = (FT_Pos)pFVar9;
      pFVar10 = pfrface[1].sizes_list.tail;
      (pfrface->bbox).xMax = (FT_Pos)pfrface[1].sizes_list.head;
      (pfrface->bbox).yMax = (FT_Pos)pFVar10;
      pfrface->units_per_EM = (FT_UShort)uVar32;
      pfrface->ascender = sVar4;
      pfrface->descender = sVar5;
      pfrface->height = (FT_Short)uVar22;
      if (uVar35 != 0) {
        pFVar18 = (FT_Bitmap_Size *)
                  ft_mem_realloc(pfrface->stream->memory,0x20,0,new_count,(void *)0x0,
                                 (FT_Error *)&local_9c);
        pfrface->available_sizes = pFVar18;
        if (local_9c == 0) {
          piVar26 = (int *)(*(long *)&pfrface[2].num_fixed_sizes + 4);
          do {
            iVar23 = *piVar26;
            pFVar18->height = (FT_Short)iVar23;
            iVar6 = piVar26[-1];
            pFVar18->width = (FT_Short)iVar6;
            uVar17 = (ulong)(uint)(iVar23 << 6);
            pFVar18->size = uVar17;
            pFVar18->x_ppem = (ulong)(uint)(iVar6 << 6);
            pFVar18->y_ppem = uVar17;
            pFVar18 = pFVar18 + 1;
            piVar26 = piVar26 + 10;
            uVar32 = (int)new_count - 1;
            new_count = (ulong)uVar32;
          } while (uVar32 != 0);
          pfrface->num_fixed_sizes = uVar35;
        }
        if (local_9c != 0) {
          return local_9c;
        }
      }
      if (((ulong)pfrface[1].autohint.data & 4) == 0) {
        uVar35 = (uint)*(ushort *)((long)&pfrface[1].autohint.data + 4);
      }
      else {
        iVar23 = *(int *)&pfrface[2].generic.data;
        uVar32 = 0;
        uVar35 = 0;
        if (iVar23 != 0) {
          puVar28 = (uint *)(pfrface[2].bbox.xMin + 4);
          do {
            uVar35 = *puVar28;
            if ((int)*puVar28 < (int)uVar32) {
              uVar35 = uVar32;
            }
            uVar32 = uVar35;
            puVar28 = puVar28 + 4;
            iVar23 = iVar23 + -1;
            uVar35 = uVar32;
          } while (iVar23 != 0);
        }
      }
      pfrface->max_advance_width = (FT_Short)uVar35;
      pfrface->max_advance_height = pfrface->height;
      lVar24 = (ulong)pfrface->units_per_EM * -0x66666667;
      pfrface->underline_position = (short)(uint)((ulong)lVar24 >> 0x22) - (short)(lVar24 >> 0x3f);
      pfrface->underline_thickness = pfrface->units_per_EM / 0x1e;
      local_98.encoding = FT_ENCODING_UNICODE;
      local_98.platform_id = 3;
      local_98.encoding_id = 1;
      local_98.face = pfrface;
      local_9c = FT_CMap_New(&pfr_cmap_class_rec,(FT_Pointer)0x0,&local_98,(FT_CMap_conflict *)0x0);
      if ((int)pfrface[2].bbox.yMin != 0) {
        *(byte *)&pfrface->face_flags = (byte)pfrface->face_flags | 0x40;
      }
    }
  }
  return local_9c;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  pfr_face_init( FT_Stream      stream,
                 FT_Face        pfrface,
                 FT_Int         face_index,
                 FT_Int         num_params,
                 FT_Parameter*  params )
  {
    PFR_Face  face = (PFR_Face)pfrface;
    FT_Error  error;

    FT_UNUSED( num_params );
    FT_UNUSED( params );


    FT_TRACE2(( "PFR driver\n" ));

    /* load the header and check it */
    error = pfr_header_load( &face->header, stream );
    if ( error )
      goto Exit;

    if ( !pfr_header_check( &face->header ) )
    {
      FT_TRACE2(( "  not a PFR font\n" ));
      error = FT_THROW( Unknown_File_Format );
      goto Exit;
    }

    /* check face index */
    {
      FT_Long  num_faces;


      error = pfr_log_font_count( stream,
                                  face->header.log_dir_offset,
                                  &num_faces );
      if ( error )
        goto Exit;

      pfrface->num_faces = num_faces;
    }

    if ( face_index < 0 )
      goto Exit;

    if ( ( face_index & 0xFFFF ) >= pfrface->num_faces )
    {
      FT_ERROR(( "pfr_face_init: invalid face index\n" ));
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* load the face */
    error = pfr_log_font_load(
              &face->log_font,
              stream,
              (FT_UInt)( face_index & 0xFFFF ),
              face->header.log_dir_offset,
              FT_BOOL( face->header.phy_font_max_size_high != 0 ) );
    if ( error )
      goto Exit;

    /* now load the physical font descriptor */
    error = pfr_phy_font_load( &face->phy_font, stream,
                               face->log_font.phys_offset,
                               face->log_font.phys_size );
    if ( error )
      goto Exit;

    /* now set up all root face fields */
    {
      PFR_PhyFont  phy_font = &face->phy_font;


      pfrface->face_index = face_index & 0xFFFF;
      pfrface->num_glyphs = (FT_Long)phy_font->num_chars + 1;

      pfrface->face_flags |= FT_FACE_FLAG_SCALABLE;

      /* if gps_offset == 0 for all characters, we  */
      /* assume that the font only contains bitmaps */
      {
        FT_UInt  nn;


        for ( nn = 0; nn < phy_font->num_chars; nn++ )
          if ( phy_font->chars[nn].gps_offset != 0 )
            break;

        if ( nn == phy_font->num_chars )
        {
          if ( phy_font->num_strikes > 0 )
            pfrface->face_flags = 0;        /* not scalable */
          else
          {
            FT_ERROR(( "pfr_face_init: font doesn't contain glyphs\n" ));
            error = FT_THROW( Invalid_File_Format );
            goto Exit;
          }
        }
      }

      if ( ( phy_font->flags & PFR_PHY_PROPORTIONAL ) == 0 )
        pfrface->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

      if ( phy_font->flags & PFR_PHY_VERTICAL )
        pfrface->face_flags |= FT_FACE_FLAG_VERTICAL;
      else
        pfrface->face_flags |= FT_FACE_FLAG_HORIZONTAL;

      if ( phy_font->num_strikes > 0 )
        pfrface->face_flags |= FT_FACE_FLAG_FIXED_SIZES;

      if ( phy_font->num_kern_pairs > 0 )
        pfrface->face_flags |= FT_FACE_FLAG_KERNING;

      /* If no family name was found in the `undocumented' auxiliary
       * data, use the font ID instead.  This sucks but is better than
       * nothing.
       */
      pfrface->family_name = phy_font->family_name;
      if ( !pfrface->family_name )
        pfrface->family_name = phy_font->font_id;

      /* note that the style name can be NULL in certain PFR fonts,
       * probably meaning `Regular'
       */
      pfrface->style_name = phy_font->style_name;

      pfrface->num_fixed_sizes = 0;
      pfrface->available_sizes = NULL;

      pfrface->bbox         = phy_font->bbox;
      pfrface->units_per_EM = (FT_UShort)phy_font->outline_resolution;
      pfrface->ascender     = (FT_Short) phy_font->bbox.yMax;
      pfrface->descender    = (FT_Short) phy_font->bbox.yMin;

      pfrface->height = (FT_Short)( ( pfrface->units_per_EM * 12 ) / 10 );
      if ( pfrface->height < pfrface->ascender - pfrface->descender )
        pfrface->height = (FT_Short)(pfrface->ascender - pfrface->descender);

      if ( phy_font->num_strikes > 0 )
      {
        FT_UInt          n, count = phy_font->num_strikes;
        FT_Bitmap_Size*  size;
        PFR_Strike       strike;
        FT_Memory        memory = pfrface->stream->memory;


        if ( FT_NEW_ARRAY( pfrface->available_sizes, count ) )
          goto Exit;

        size   = pfrface->available_sizes;
        strike = phy_font->strikes;
        for ( n = 0; n < count; n++, size++, strike++ )
        {
          size->height = (FT_Short)strike->y_ppm;
          size->width  = (FT_Short)strike->x_ppm;
          size->size   = (FT_Pos)( strike->y_ppm << 6 );
          size->x_ppem = (FT_Pos)( strike->x_ppm << 6 );
          size->y_ppem = (FT_Pos)( strike->y_ppm << 6 );
        }
        pfrface->num_fixed_sizes = (FT_Int)count;
      }

      /* now compute maximum advance width */
      if ( ( phy_font->flags & PFR_PHY_PROPORTIONAL ) == 0 )
        pfrface->max_advance_width = (FT_Short)phy_font->standard_advance;
      else
      {
        FT_Int    max = 0;
        FT_UInt   count = phy_font->num_chars;
        PFR_Char  gchar = phy_font->chars;


        for ( ; count > 0; count--, gchar++ )
        {
          if ( max < gchar->advance )
            max = gchar->advance;
        }

        pfrface->max_advance_width = (FT_Short)max;
      }

      pfrface->max_advance_height = pfrface->height;

      pfrface->underline_position  = (FT_Short)( -pfrface->units_per_EM / 10 );
      pfrface->underline_thickness = (FT_Short)(  pfrface->units_per_EM / 30 );

      /* create charmap */
      {
        FT_CharMapRec  charmap;


        charmap.face        = pfrface;
        charmap.platform_id = TT_PLATFORM_MICROSOFT;
        charmap.encoding_id = TT_MS_ID_UNICODE_CS;
        charmap.encoding    = FT_ENCODING_UNICODE;

        error = FT_CMap_New( &pfr_cmap_class_rec, NULL, &charmap, NULL );
      }

      /* check whether we have loaded any kerning pairs */
      if ( phy_font->num_kern_pairs )
        pfrface->face_flags |= FT_FACE_FLAG_KERNING;
    }

  Exit:
    return error;
  }